

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emu2413.c
# Opt level: O3

void EOPLL_dumpToPatch(uint8_t *dump,EOPLL_PATCH *patch)

{
  patch->AM = (uint)(*dump >> 7);
  patch[1].AM = (uint)(dump[1] >> 7);
  patch->PM = *dump >> 6 & 1;
  patch[1].PM = dump[1] >> 6 & 1;
  patch->EG = *dump >> 5 & 1;
  patch[1].EG = dump[1] >> 5 & 1;
  patch->KR = *dump >> 4 & 1;
  patch[1].KR = dump[1] >> 4 & 1;
  patch->ML = *dump & 0xf;
  patch[1].ML = dump[1] & 0xf;
  patch->KL = (uint)(dump[2] >> 6);
  patch[1].KL = (uint)(dump[3] >> 6);
  patch->TL = dump[2] & 0x3f;
  patch[1].TL = 0;
  patch->FB = dump[3] & 7;
  patch[1].FB = 0;
  patch->WS = dump[3] >> 3 & 1;
  patch[1].WS = dump[3] >> 4 & 1;
  patch->AR = (uint)(dump[4] >> 4);
  patch[1].AR = (uint)(dump[5] >> 4);
  patch->DR = dump[4] & 0xf;
  patch[1].DR = dump[5] & 0xf;
  patch->SL = (uint)(dump[6] >> 4);
  patch[1].SL = (uint)(dump[7] >> 4);
  patch->RR = dump[6] & 0xf;
  patch[1].RR = dump[7] & 0xf;
  return;
}

Assistant:

void EOPLL_dumpToPatch(const uint8_t *dump, EOPLL_PATCH *patch) {
  patch[0].AM = (dump[0] >> 7) & 1;
  patch[1].AM = (dump[1] >> 7) & 1;
  patch[0].PM = (dump[0] >> 6) & 1;
  patch[1].PM = (dump[1] >> 6) & 1;
  patch[0].EG = (dump[0] >> 5) & 1;
  patch[1].EG = (dump[1] >> 5) & 1;
  patch[0].KR = (dump[0] >> 4) & 1;
  patch[1].KR = (dump[1] >> 4) & 1;
  patch[0].ML = (dump[0]) & 15;
  patch[1].ML = (dump[1]) & 15;
  patch[0].KL = (dump[2] >> 6) & 3;
  patch[1].KL = (dump[3] >> 6) & 3;
  patch[0].TL = (dump[2]) & 63;
  patch[1].TL = 0;
  patch[0].FB = (dump[3]) & 7;
  patch[1].FB = 0;
  patch[0].WS = (dump[3] >> 3) & 1;
  patch[1].WS = (dump[3] >> 4) & 1;
  patch[0].AR = (dump[4] >> 4) & 15;
  patch[1].AR = (dump[5] >> 4) & 15;
  patch[0].DR = (dump[4]) & 15;
  patch[1].DR = (dump[5]) & 15;
  patch[0].SL = (dump[6] >> 4) & 15;
  patch[1].SL = (dump[7] >> 4) & 15;
  patch[0].RR = (dump[6]) & 15;
  patch[1].RR = (dump[7]) & 15;
}